

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O1

natwm_error client_unset_fullscreen(natwm_state *state,client *client)

{
  uint16_t previous_border_width;
  
  previous_border_width = client_get_active_border_width(state->workspace_list->theme,client);
  client->is_fullscreen = false;
  ewmh_remove_window_state(state,client->window);
  client_configure_window_rect(state->xcb,client->window,client->rect,(uint)previous_border_width);
  update_theme(state,client,previous_border_width);
  return NO_ERROR;
}

Assistant:

enum natwm_error client_unset_fullscreen(const struct natwm_state *state, struct client *client)
{
        struct theme *theme = state->workspace_list->theme;
        uint16_t border_width = client_get_active_border_width(theme, client);

        client->is_fullscreen = false;

        ewmh_remove_window_state(state, client->window);

        client_configure_window_rect(state->xcb, client->window, client->rect, border_width);

        update_theme(state, client, border_width);

        return NO_ERROR;
}